

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::operator()(extreme_value_dist<float> *this,lcg64_shift *r)

{
  param_type *in_RDI;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  float fVar3;
  
  rVar1 = param_type::eta(in_RDI);
  rVar2 = param_type::theta(in_RDI);
  utility::uniformoo<float,trng::lcg64_shift>((lcg64_shift *)0x322aed);
  math::ln(0.0);
  fVar3 = math::ln(0.0);
  return rVar2 * fVar3 + rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.eta() + P.theta() * math::ln(-math::ln(utility::uniformoo<result_type>(r)));
    }